

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmxmdp.cpp
# Opt level: O0

void __thiscall GMXMDP::setAB(GMXMDP *this)

{
  bool bVar1;
  dblopts *key2opt;
  vecopts *key2opt_00;
  allocator local_1c9;
  string local_1c8;
  allocator local_1a1;
  string local_1a0;
  allocator local_179;
  string local_178;
  allocator local_151;
  string local_150;
  reference local_130;
  GMXPGRP *pgrp;
  iterator __end1;
  iterator __begin1;
  vector<GMXMDP::GMXPGRP,_std::allocator<GMXMDP::GMXPGRP>_> *__range1;
  string local_108;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  GMXMDP *local_10;
  GMXMDP *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"ref-t",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"sim-temp-high",&local_69);
  setMDPABpair<double>(&this->key2val,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"ref-p",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"sim-press-high",&local_b9);
  setMDPABpair<double>(&this->key2val,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"high",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"low",(allocator *)((long)&__range1 + 7));
  setMDPABpair<double>(&this->key2val,&local_e0,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  __end1 = std::vector<GMXMDP::GMXPGRP,_std::allocator<GMXMDP::GMXPGRP>_>::begin(&this->pgrps);
  pgrp = (GMXPGRP *)
         std::vector<GMXMDP::GMXPGRP,_std::allocator<GMXMDP::GMXPGRP>_>::end(&this->pgrps);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<GMXMDP::GMXPGRP_*,_std::vector<GMXMDP::GMXPGRP,_std::allocator<GMXMDP::GMXPGRP>_>_>
                                *)&pgrp);
    if (!bVar1) break;
    local_130 = __gnu_cxx::
                __normal_iterator<GMXMDP::GMXPGRP_*,_std::vector<GMXMDP::GMXPGRP,_std::allocator<GMXMDP::GMXPGRP>_>_>
                ::operator*(&__end1);
    key2opt = &local_130->key2val;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_150,"",&local_151);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_178,"B",&local_179);
    setMDPABpair<double>(key2opt,&local_150,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    key2opt_00 = &local_130->key2vvec;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1a0,"",&local_1a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1c8,"B",&local_1c9);
    setMDPABpair<std::vector<double,std::allocator<double>>>(key2opt_00,&local_1a0,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    __gnu_cxx::
    __normal_iterator<GMXMDP::GMXPGRP_*,_std::vector<GMXMDP::GMXPGRP,_std::allocator<GMXMDP::GMXPGRP>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void GMXMDP::setAB() {
  //First set the temperature to ref-t
  setMDPABpair(key2val, "ref-t", "sim-temp-high");
  //Do the same thing to pressure
  setMDPABpair(key2val, "ref-p", "sim-press-high");
  //Now sync. the high and low pressure/temperature
  setMDPABpair(key2val, "high", "low");
  //Then are the pull-group parameters
  for(auto& pgrp : pgrps) {
    setMDPABpair(pgrp.key2val);
    setMDPABpair(pgrp.key2vvec);
  }
}